

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_uninit__pulse(ma_context *pContext)

{
  ma_context *pContext_local;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4f5a,"ma_result ma_context_uninit__pulse(ma_context *)");
  }
  if (pContext->backend == ma_backend_pulseaudio) {
    ma_free((pContext->field_21).alsa.snd_pcm_recover,&pContext->allocationCallbacks);
    (pContext->field_21).alsa.snd_pcm_recover = (ma_proc)0x0;
    ma_free((pContext->field_21).alsa.snd_pcm_mmap_commit,&pContext->allocationCallbacks);
    (pContext->field_21).alsa.snd_pcm_mmap_commit = (ma_proc)0x0;
    ma_dlclose(pContext,(pContext->field_21).alsa.asoundSO);
    return 0;
  }
  __assert_fail("pContext->backend == ma_backend_pulseaudio",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x4f5b,"ma_result ma_context_uninit__pulse(ma_context *)");
}

Assistant:

static ma_result ma_context_uninit__pulse(ma_context* pContext)
{
    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pContext->backend == ma_backend_pulseaudio);

    ma_free(pContext->pulse.pServerName, &pContext->allocationCallbacks);
    pContext->pulse.pServerName = NULL;

    ma_free(pContext->pulse.pApplicationName, &pContext->allocationCallbacks);
    pContext->pulse.pApplicationName = NULL;

#ifndef MA_NO_RUNTIME_LINKING
    ma_dlclose(pContext, pContext->pulse.pulseSO);
#endif

    return MA_SUCCESS;
}